

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeSetNumCols(Vdbe *p,int nResColumn)

{
  ushort uVar1;
  sqlite3 *db;
  Mem *pMVar2;
  int *piVar3;
  uint uVar4;
  
  db = p->db;
  uVar1 = p->nResAlloc;
  if (uVar1 != 0) {
    releaseMemArray(p->aColName,(uint)uVar1 + (uint)uVar1 * 4);
    if (p->aColName != (Mem *)0x0) {
      sqlite3DbFreeNN(db,p->aColName);
    }
  }
  p->nResAlloc = (u16)nResColumn;
  p->nResColumn = (u16)nResColumn;
  pMVar2 = (Mem *)sqlite3DbMallocRawNN(db,(long)(nResColumn * 5) * 0x38);
  p->aColName = pMVar2;
  if (0 < nResColumn && pMVar2 != (Mem *)0x0) {
    uVar4 = nResColumn * 5 + 1;
    piVar3 = &pMVar2->szMalloc;
    do {
      *(u16 *)(piVar3 + -3) = 1;
      *(sqlite3 **)(piVar3 + -2) = db;
      *piVar3 = 0;
      uVar4 = uVar4 - 1;
      piVar3 = piVar3 + 0xe;
    } while (1 < uVar4);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSetNumCols(Vdbe *p, int nResColumn){
  int n;
  sqlite3 *db = p->db;

  if( p->nResAlloc ){
    releaseMemArray(p->aColName, p->nResAlloc*COLNAME_N);
    sqlite3DbFree(db, p->aColName);
  }
  n = nResColumn*COLNAME_N;
  p->nResColumn = p->nResAlloc = (u16)nResColumn;
  p->aColName = (Mem*)sqlite3DbMallocRawNN(db, sizeof(Mem)*n );
  if( p->aColName==0 ) return;
  initMemArray(p->aColName, n, db, MEM_Null);
}